

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int detach_get_handle(DETACH_HANDLE detach,handle *handle_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  uint32_t local_1c;
  
  if (detach == (DETACH_HANDLE)0x0) {
    iVar3 = 0x2485;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(detach->composite_value,&local_1c);
    iVar3 = 0x248d;
    if (iVar1 == 0) {
      if (local_1c == 0) {
        iVar3 = 0x2493;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(detach->composite_value,0);
        iVar3 = 0x249b;
        if ((value != (AMQP_VALUE)0x0) &&
           (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)) {
          iVar1 = amqpvalue_get_uint(value,handle_value);
          iVar3 = 0x24a2;
          if (iVar1 == 0) {
            iVar3 = 0;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int detach_get_handle(DETACH_HANDLE detach, handle* handle_value)
{
    int result;

    if (detach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        DETACH_INSTANCE* detach_instance = (DETACH_INSTANCE*)detach;
        if (amqpvalue_get_composite_item_count(detach_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(detach_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_handle(item_value, handle_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}